

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pointer __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::iterator::operator->(iterator *this)

{
  code *pcVar1;
  reference ppVar2;
  ctrl_t *pcVar3;
  pointer extraout_RAX;
  pointer extraout_RAX_00;
  pointer prVar4;
  code *in_RCX;
  undefined4 *puVar5;
  long extraout_RDX;
  undefined8 *unaff_RBX;
  ctrl_t *in_RSI;
  char *pcVar6;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 *unaff_R12;
  undefined8 *unaff_R14;
  slot_type *__n;
  undefined8 *unaff_R15;
  string_view data;
  char *pcStack_108;
  size_t sStack_100;
  char cStack_f8;
  undefined7 uStack_f7;
  Output *pOStack_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  slot_type *psStack_38;
  
  pcVar1 = (code *)this->ctrl_;
  if (pcVar1 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::iterator::operator->((iterator *)this);
LAB_00115fab:
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::iterator::operator->((iterator *)this);
  }
  else {
    in_RCX = std::__cxx11::string::_M_create;
    if (pcVar1 == std::__cxx11::string::_M_create) goto LAB_00115fab;
    if (-1 < (char)*pcVar1) {
      ppVar2 = operator*(this);
      return ppVar2;
    }
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::iterator::operator->((iterator *)this);
  pcVar1 = (code *)this->ctrl_;
  if (pcVar1 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    in_RCX = std::__cxx11::string::_M_create;
    if (pcVar1 != std::__cxx11::string::_M_create) {
      if (-1 < (char)*pcVar1) {
        return (pointer)(this->field_1).slot_;
      }
      goto LAB_00115fe4;
    }
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::iterator::operator*((iterator *)this);
LAB_00115fe4:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::__cxx11::string>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::iterator::operator*((iterator *)this);
  puVar5 = (undefined4 *)
           CONCAT71((int7)((ulong)in_RCX >> 8),extraout_RDX == 0 || in_RSI != (ctrl_t *)0x0);
  if (extraout_RDX == 0 || in_RSI != (ctrl_t *)0x0) {
    __n = (slot_type *)(extraout_RDX - (long)in_RSI);
    psStack_38 = __n;
    if ((slot_type *)0xf < __n) {
      pcVar3 = (ctrl_t *)std::__cxx11::string::_M_create((ulong *)this,(ulong)&psStack_38);
      this->ctrl_ = pcVar3;
      this[1].ctrl_ = (ctrl_t *)psStack_38;
    }
    if (__n != (slot_type *)0x0) {
      if (__n == (slot_type *)0x1) {
        *this->ctrl_ = *in_RSI;
      }
      else {
        memcpy(this->ctrl_,in_RSI,(size_t)__n);
      }
    }
    (this->field_1).slot_ = psStack_38;
    this->ctrl_[(long)psStack_38] = ~kSentinel;
    return (pointer)psStack_38;
  }
  pcVar6 = "basic_string::_M_construct null not valid";
  std::__throw_logic_error("basic_string::_M_construct null not valid");
  uStack_e0 = *puVar5;
  uStack_dc = puVar5[1];
  uStack_d8 = puVar5[2];
  uStack_d4 = puVar5[3];
  uStack_c8 = *in_R8;
  uStack_d0 = in_R8[1];
  uStack_b8 = *in_R9;
  uStack_c0 = in_R9[1];
  uStack_a8 = *unaff_RBX;
  uStack_b0 = unaff_RBX[1];
  uStack_98 = *unaff_R12;
  uStack_a0 = unaff_R12[1];
  uStack_88 = *unaff_R14;
  uStack_90 = unaff_R14[1];
  uStack_78 = *unaff_R15;
  uStack_80 = unaff_R15[1];
  sStack_100 = 0;
  cStack_f8 = '\0';
  pcStack_108 = &cStack_f8;
  pOStack_e8 = (Output *)pcVar6;
  absl::lts_20240722::substitute_internal::SubstituteAndAppendArray(&pcStack_108);
  data._M_str = pcStack_108;
  data._M_len = sStack_100;
  upb::generator::Output::Write(pOStack_e8,data);
  prVar4 = extraout_RAX;
  if (pcStack_108 != &cStack_f8) {
    operator_delete(pcStack_108,CONCAT71(uStack_f7,cStack_f8) + 1);
    prVar4 = extraout_RAX_00;
  }
  return prVar4;
}

Assistant:

pointer operator->() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator->");
      return &operator*();
    }